

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

Int64 __thiscall Json::Value::asInt64(Value *this)

{
  bool bVar1;
  double *in_RDI;
  ostringstream oss_3;
  ostringstream oss_2;
  longlong val;
  ostringstream oss_1;
  ostringstream oss;
  longlong in_stack_fffffffffffff908;
  longlong *in_stack_fffffffffffff910;
  ostringstream *poVar2;
  char *in_stack_fffffffffffff918;
  undefined7 in_stack_fffffffffffff920;
  byte in_stack_fffffffffffff927;
  string local_6a8 [16];
  Value *in_stack_fffffffffffff968;
  ostringstream local_688 [376];
  string local_510 [32];
  ostringstream local_4f0 [24];
  Value *in_stack_fffffffffffffb28;
  string local_378 [32];
  double local_358;
  string local_350 [32];
  ostringstream local_330 [376];
  string local_1b8 [48];
  ostringstream local_188 [384];
  double local_8;
  
  switch(*(undefined1 *)(in_RDI + 1)) {
  case 0:
    local_8 = 0.0;
    break;
  case 1:
  case 3:
    local_8 = *in_RDI;
    break;
  case 2:
    bVar1 = isInt64(in_stack_fffffffffffff968);
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream(local_188);
      std::operator<<((ostream *)local_188,"LargestUInt out of Int64 range");
      std::__cxx11::ostringstream::str();
      throwLogicError((string *)CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920));
      std::__cxx11::string::~string(local_1b8);
      abort();
    }
    local_8 = *in_RDI;
    break;
  case 4:
    bVar1 = InRange<long_long,long_long>
                      ((double)in_stack_fffffffffffff910,in_stack_fffffffffffff908,0x184d3b);
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream(local_330);
      std::operator<<((ostream *)local_330,"double out of Int64 range");
      std::__cxx11::ostringstream::str();
      throwLogicError((string *)CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920));
      std::__cxx11::string::~string(local_350);
      abort();
    }
    local_8 = (double)(long)*in_RDI;
    break;
  case 5:
    asString_abi_cxx11_(in_stack_fffffffffffffb28);
    std::__cxx11::string::c_str();
    bVar1 = converToInt64(in_stack_fffffffffffff918,in_stack_fffffffffffff910);
    in_stack_fffffffffffff927 = bVar1 ^ 0xff;
    std::__cxx11::string::~string(local_378);
    if ((in_stack_fffffffffffff927 & 1) != 0) goto switchD_00184c35_default;
    bVar1 = IsInRange<long_long,long_long,long_long>
                      ((longlong)local_358,-0x8000000000000000,0x7fffffffffffffff);
    if (!bVar1) {
      poVar2 = local_4f0;
      std::__cxx11::ostringstream::ostringstream(poVar2);
      std::operator<<((ostream *)poVar2,"LargestUInt out of Int64 range");
      std::__cxx11::ostringstream::str();
      throwLogicError((string *)CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920));
      std::__cxx11::string::~string(local_510);
      abort();
    }
    local_8 = local_358;
    break;
  case 6:
    local_8 = (double)(long)(int)(uint)(((ulong)*in_RDI & 1) != 0);
    break;
  default:
switchD_00184c35_default:
    poVar2 = local_688;
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::operator<<((ostream *)poVar2,"Value is not convertible to Int64.");
    std::__cxx11::ostringstream::str();
    throwLogicError((string *)CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920));
    std::__cxx11::string::~string(local_6a8);
    abort();
  }
  return (Int64)local_8;
}

Assistant:

Value::Int64 Value::asInt64() const {
  switch (type_) {
  case int64Value:
  case intValue:
    return Int64(value_.int_);
  case uintValue:
    JSON_ASSERT_MESSAGE(isInt64(), "LargestUInt out of Int64 range");
    return Int64(value_.uint_);
  case realValue:
    JSON_ASSERT_MESSAGE(InRange(value_.real_, minInt64, maxInt64),
                        "double out of Int64 range");
    return Int64(value_.real_);
  case nullValue:
    return 0;
  case booleanValue:
    return value_.bool_ ? 1 : 0;
  case stringValue: {
    long long int val;

    if (!converToInt64 (asString().c_str(), &val)) {
      break;
    }

    JSON_ASSERT_MESSAGE(IsInRange (val, minInt64, maxInt64),
                        "LargestUInt out of Int64 range");
    return Int64(val);
  }
  default:
    break;
  }
  JSON_FAIL_MESSAGE("Value is not convertible to Int64.");
}